

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void check_permission(char *filename,uint mode)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_fs_t req;
  uv_fs_t local_1c0;
  
  iVar1 = uv_fs_stat((uv_loop_t *)0x0,&local_1c0,filename,(uv_fs_cb)0x0);
  if (iVar1 == 0) {
    if (local_1c0.result == 0) {
      if (((uint)local_1c0.statbuf.st_mode & 0x1ff) == mode) {
        uv_fs_req_cleanup(&local_1c0);
        return;
      }
      pcVar3 = "(s->st_mode & 0777) == mode";
      uVar2 = 0xb8;
    }
    else {
      pcVar3 = "req.result == 0";
      uVar2 = 0xae;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0xad;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void check_permission(const char* filename, unsigned int mode) {
  int r;
  uv_fs_t req;
  uv_stat_t* s;

  r = uv_fs_stat(NULL, &req, filename, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);

  s = &req.statbuf;
#if defined(_WIN32) || defined(__CYGWIN__) || defined(__MSYS__)
  /*
   * On Windows, chmod can only modify S_IWUSR (_S_IWRITE) bit,
   * so only testing for the specified flags.
   */
  ASSERT((s->st_mode & 0777) & mode);
#else
  ASSERT((s->st_mode & 0777) == mode);
#endif

  uv_fs_req_cleanup(&req);
}